

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall tf::Graph::~Graph(Graph *this)

{
  pointer ppNVar1;
  vector<tf::Node_*,_std::allocator<tf::Node_*>_> *__range1;
  pointer ppNVar2;
  
  ppNVar1 = (this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar2 = (this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar2 != ppNVar1; ppNVar2 = ppNVar2 + 1) {
    ObjectPool<tf::Node,_65536UL>::recycle((ObjectPool<tf::Node,_65536UL> *)node_pool,*ppNVar2);
  }
  ppNVar2 = (this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar2) {
    (this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar2;
  }
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2,(long)(this->_nodes).
                                  super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar2)
    ;
    return;
  }
  return;
}

Assistant:

inline Graph::~Graph() {
  _clear();
}